

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O3

void __thiscall EDCircles::EDCircles(EDCircles *this,Mat *srcImage)

{
  undefined8 *puVar1;
  double dVar2;
  double dVar3;
  pointer pvVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  long lVar9;
  long lVar10;
  pointer pLVar11;
  bool bVar12;
  Circle *pCVar13;
  pointer *ppPVar14;
  int *piVar15;
  BufferManager *pBVar16;
  double *pdVar17;
  Info *pIVar18;
  EDArcs *pEVar19;
  ulong uVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  int iVar25;
  long lVar26;
  pointer pLVar27;
  double *x;
  uint N;
  ulong uVar28;
  long lVar29;
  double dVar30;
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined4 uVar34;
  undefined4 uVar35;
  double dVar36;
  double yc;
  double circleFitError;
  double r;
  vector<LineSegment,_std::allocator<LineSegment>_> lines;
  double major;
  double xc;
  EllipseEquation eq;
  double minor;
  double local_1b0;
  double local_1a8;
  Mat *local_1a0;
  vector<LineSegment,_std::allocator<LineSegment>_> local_198;
  double local_180;
  double local_178;
  double dStack_170;
  int *local_160;
  vector<mEllipse,_std::allocator<mEllipse>_> *local_158;
  vector<mCircle,_std::allocator<mCircle>_> *local_150;
  mEllipse local_148;
  double local_128;
  double dStack_120;
  EllipseEquation local_118;
  Mat *local_e0;
  double local_d8;
  vector<LineSegment,_std::allocator<LineSegment>_> local_d0;
  double local_b8;
  double dStack_b0;
  undefined1 local_a8 [16];
  undefined8 local_98;
  Mat local_90 [96];
  
  cv::Mat::Mat(local_90,srcImage);
  EDPF::EDPF(&this->super_EDPF,local_90);
  cv::Mat::~Mat(local_90);
  local_150 = &this->circles;
  local_158 = &this->ellipses;
  this->noCircles1 = 0;
  (this->circles).super__Vector_base<mCircle,_std::allocator<mCircle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->circles).super__Vector_base<mCircle,_std::allocator<mCircle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->circles).super__Vector_base<mCircle,_std::allocator<mCircle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ellipses).super__Vector_base<mEllipse,_std::allocator<mEllipse>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ellipses).super__Vector_base<mEllipse,_std::allocator<mEllipse>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ellipses).super__Vector_base<mEllipse,_std::allocator<mEllipse>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar21 = (this->super_EDPF).super_ED.height + (this->super_EDPF).super_ED.width;
  uVar28 = (ulong)(iVar21 * 8);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar28;
  uVar20 = 0xffffffffffffffff;
  if (SUB168(auVar33 * ZEXT816(0x98),8) == 0) {
    uVar20 = SUB168(auVar33 * ZEXT816(0x98),0);
  }
  pCVar13 = (Circle *)operator_new__(uVar20);
  if (iVar21 != 0) {
    lVar23 = 0;
    do {
      puVar1 = (undefined8 *)((long)(pCVar13->eq).coeff + lVar23 + 0x20);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)(pCVar13->eq).coeff + lVar23 + 0x10);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)(pCVar13->eq).coeff + lVar23);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)(pCVar13->eq).coeff + lVar23 + 0x30) = 0;
      lVar23 = lVar23 + 0x98;
    } while (uVar28 * 0x98 - lVar23 != 0);
  }
  this->circles1 = pCVar13;
  pvVar4 = (this->super_EDPF).super_ED.segmentPoints.
           super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar23 = (long)(this->super_EDPF).super_ED.segmentPoints.
                 super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4;
  if (lVar23 == 0) {
    iVar21 = 0;
  }
  else {
    lVar23 = (lVar23 >> 3) * -0x5555555555555555;
    lVar23 = lVar23 + (ulong)(lVar23 == 0);
    ppPVar14 = (pointer *)
               ((long)&(pvVar4->
                       super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
                       _M_impl.super__Vector_impl_data + 8);
    iVar21 = 0;
    do {
      iVar21 = iVar21 + (int)((ulong)((long)*ppPVar14 -
                                     (long)((_Vector_impl_data *)(ppPVar14 + -1))->_M_start) >> 3);
      ppPVar14 = ppPVar14 + 3;
      lVar23 = lVar23 + -1;
    } while (lVar23 != 0);
  }
  iVar24 = (this->super_EDPF).super_ED.segmentNos;
  lVar23 = (long)iVar24;
  uVar20 = 0xffffffffffffffff;
  if (-2 < lVar23) {
    uVar20 = lVar23 * 4 + 4;
  }
  local_e0 = srcImage;
  piVar15 = (int *)operator_new__(uVar20);
  this->segmentStartLines = piVar15;
  pBVar16 = (BufferManager *)operator_new(0x18);
  uVar20 = 0xffffffffffffffff;
  if (-1 < iVar21) {
    uVar20 = (ulong)(uint)(iVar21 * 8) << 3;
  }
  pdVar17 = (double *)operator_new__(uVar20);
  pBVar16->x = pdVar17;
  pdVar17 = (double *)operator_new__(uVar20);
  local_160 = &this->noCircles1;
  pBVar16->y = pdVar17;
  pBVar16->index = 0;
  this->bm = pBVar16;
  local_198.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < iVar24) {
    lVar22 = 0;
    do {
      this->segmentStartLines[lVar22] =
           (int)((ulong)((long)local_198.
                               super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl
                               .super__Vector_impl_data._M_finish -
                        (long)local_198.
                              super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3) * 0x38e38e39;
      pvVar4 = (this->super_EDPF).super_ED.segmentPoints.
               super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar23 = *(long *)&pvVar4[lVar22].
                         super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                         _M_impl.super__Vector_impl_data;
      N = (uint)((long)*(pointer *)
                        ((long)&pvVar4[lVar22].
                                super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                ._M_impl.super__Vector_impl_data + 8) - lVar23 >> 3);
      if ((int)N < 0xc) goto LAB_0010ac7f;
      pBVar16 = this->bm;
      x = pBVar16->x + pBVar16->index;
      pdVar17 = pBVar16->y + pBVar16->index;
      uVar20 = 0;
      do {
        x[uVar20] = (double)*(int *)(lVar23 + uVar20 * 8);
        pdVar17[uVar20] = (double)*(int *)(lVar23 + 4 + uVar20 * 8);
        uVar20 = uVar20 + 1;
      } while ((N & 0x7fffffff) != uVar20);
      if ((int)N < 0x18) {
LAB_0010ac57:
        EDLines::SplitSegment2Lines(x,pdVar17,N,(int)lVar22,&local_198,6,1.0);
      }
      else {
        dVar31 = ((double)(int)N / 6.283185307179586) * 0.25;
        if (dVar31 <= 3.0) {
          dVar31 = 3.0;
        }
        if (dVar31 < SQRT((*x - x[N - 1]) * (*x - x[N - 1]) +
                          (*pdVar17 - pdVar17[N - 1]) * (*pdVar17 - pdVar17[N - 1])))
        goto LAB_0010ac57;
        local_1a8 = 10000000000.0;
        local_178 = (double)(int)N;
        CircleFit(x,pdVar17,N,(double *)&local_148,&local_1b0,(double *)&local_1a0,&local_1a8);
        local_118.coeff[4] = 0.0;
        local_118.coeff[5] = 0.0;
        local_118.coeff[2] = 0.0;
        local_118.coeff[3] = 0.0;
        local_118.coeff[0] = 0.0;
        local_118.coeff[1] = 0.0;
        local_118.coeff[6] = 0.0;
        local_128 = local_1a8;
        uVar34 = 0x20000000;
        uVar35 = 0x4202a05f;
        if (1.5 < local_1a8) {
          bVar12 = EllipseFit(x,pdVar17,N,&local_118,1);
          uVar34 = 0x20000000;
          uVar35 = 0x4202a05f;
          if (bVar12) {
            dVar31 = ComputeEllipseError(&local_118,x,pdVar17,N);
            uVar34 = SUB84(dVar31,0);
            uVar35 = (undefined4)((ulong)dVar31 >> 0x20);
          }
        }
        if (local_128 <= 1.5) {
          pCVar13 = this->circles1;
          iVar21 = this->noCircles1;
          pCVar13[iVar21].xc = local_148.center.x;
          pCVar13[iVar21].yc = local_1b0;
          pCVar13[iVar21].r = (double)local_1a0;
          pCVar13[iVar21].circleFitError = local_128;
          pCVar13[iVar21].coverRatio = local_178 / ((double)local_1a0 * 6.283185307179586);
          pCVar13[iVar21].x = x;
          pCVar13[iVar21].y = pdVar17;
          pCVar13[iVar21].noPixels = N;
          iVar21 = this->noCircles1;
          pCVar13[iVar21].isEllipse = false;
          this->noCircles1 = iVar21 + 1;
          piVar15 = &this->bm->index;
          *piVar15 = *piVar15 + N;
        }
        else {
          if (1.5 < (double)CONCAT44(uVar35,uVar34)) goto LAB_0010ac57;
          local_178 = (double)CONCAT44(uVar35,uVar34);
          ComputeEllipseCenterAndAxisLengths
                    (&local_118,(double *)&local_148,&local_1b0,&local_180,&local_d8);
          uVar35 = SUB84(local_180,0);
          uVar34 = (undefined4)((ulong)local_180 >> 0x20);
          dVar31 = local_d8;
          if (local_d8 <= local_180) {
            uVar35 = SUB84(local_d8,0);
            uVar34 = (undefined4)((ulong)local_d8 >> 0x20);
            dVar31 = local_180;
          }
          if (dVar31 < (double)CONCAT44(uVar34,uVar35) * 8.0) {
            addCircle(this->circles1,local_160,local_148.center.x,local_1b0,(double)local_1a0,
                      local_128,&local_118,local_178,x,pdVar17,N);
            piVar15 = &this->bm->index;
            *piVar15 = *piVar15 + N;
          }
        }
      }
LAB_0010ac7f:
      lVar22 = lVar22 + 1;
      lVar23 = (long)(this->super_EDPF).super_ED.segmentNos;
    } while (lVar22 < lVar23);
    piVar15 = this->segmentStartLines;
  }
  pLVar27 = local_198.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar20 = ((long)local_198.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_198.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
  piVar15[lVar23] = (int)uVar20;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar20;
  uVar20 = 0xffffffffffffffff;
  if (SUB168(auVar5 * ZEXT816(0x18),8) == 0) {
    uVar20 = SUB168(auVar5 * ZEXT816(0x18),0);
  }
  pIVar18 = (Info *)operator_new__(uVar20);
  this->info = pIVar18;
  iVar21 = (this->super_EDPF).super_ED.segmentNos;
  if (0 < iVar21) {
    lVar23 = 0;
    do {
      lVar22 = (long)piVar15[lVar23];
      lVar26 = lVar23 + 1;
      uVar20 = (ulong)(uint)piVar15[lVar23 + 1];
      if (piVar15[lVar23] < piVar15[lVar23 + 1]) {
        lVar29 = lVar22 * 0x18 + 0x10;
        lVar9 = lVar22 * 0x48;
        do {
          lVar10 = lVar9 + 0x48;
          if ((int)lVar22 == (int)uVar20 + -1) {
            lVar10 = (long)piVar15[lVar23] * 0x48;
          }
          dVar31 = *(double *)
                    ((long)&(local_198.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>
                             ._M_impl.super__Vector_impl_data._M_start)->ex + lVar9);
          dVar30 = *(double *)
                    ((long)&(local_198.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>
                             ._M_impl.super__Vector_impl_data._M_start)->ey + lVar9);
          dVar2 = *(double *)
                   ((long)&(local_198.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>.
                            _M_impl.super__Vector_impl_data._M_start)->sx + lVar10);
          dVar3 = *(double *)
                   ((long)&(local_198.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>.
                            _M_impl.super__Vector_impl_data._M_start)->sy + lVar10);
          dVar8 = dVar31 - dVar2;
          dVar36 = dVar30 - dVar3;
          if (15.0 <= SQRT(dVar8 * dVar8 + dVar36 * dVar36)) {
            *(undefined8 *)((long)pIVar18 + lVar29 + -8) = 0x4024000000000000;
            *(undefined4 *)((long)pIVar18 + lVar29 + -0x10) = 2;
            *(undefined1 *)((long)&pIVar18->sign + lVar29) = 0;
          }
          else {
            local_128 = dVar31 - *(double *)
                                  ((long)&(local_198.
                                           super__Vector_base<LineSegment,_std::allocator<LineSegment>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->sx + lVar9);
            dStack_120 = *(double *)
                          ((long)&(local_198.
                                   super__Vector_base<LineSegment,_std::allocator<LineSegment>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->ex + lVar10) - dVar2;
            local_178 = dVar30 - *(double *)
                                  ((long)&(local_198.
                                           super__Vector_base<LineSegment,_std::allocator<LineSegment>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->sy + lVar9);
            dStack_170 = *(double *)
                          ((long)&(local_198.
                                   super__Vector_base<LineSegment,_std::allocator<LineSegment>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->ey + lVar10) - dVar3;
            auVar32._0_8_ = local_178 * local_178;
            auVar32._8_8_ = dStack_170 * dStack_170;
            dVar31 = dStack_120 * dStack_120 + auVar32._8_8_;
            auVar7._8_4_ = SUB84(dVar31,0);
            auVar7._0_8_ = local_128 * local_128 + auVar32._0_8_;
            auVar7._12_4_ = (int)((ulong)dVar31 >> 0x20);
            auVar33 = sqrtpd(auVar32,auVar7);
            local_a8._8_4_ = SUB84(dStack_170,0);
            local_a8._0_8_ = dStack_170;
            local_a8._12_4_ = (int)((ulong)dStack_170 >> 0x20);
            dVar31 = (local_128 * dStack_120 + local_178 * dStack_170) /
                     (auVar33._8_8_ * auVar33._0_8_);
            dVar30 = 1.0;
            if ((dVar31 <= 1.0) && (dVar30 = dVar31, dVar31 < -1.0)) {
              dVar30 = -1.0;
            }
            local_b8 = dStack_120;
            dStack_b0 = dStack_120;
            dVar31 = acos(dVar30);
            pIVar18 = this->info;
            *(double *)((long)pIVar18 + lVar29 + -8) = dVar31;
            *(uint *)((long)pIVar18 + lVar29 + -0x10) =
                 -(uint)(local_128 * (double)local_a8._0_8_ - local_b8 * local_178 < 0.0) | 1;
            *(undefined1 *)((long)&pIVar18->sign + lVar29) = 0;
            piVar15 = this->segmentStartLines;
          }
          lVar22 = lVar22 + 1;
          uVar20 = (ulong)piVar15[lVar26];
          lVar29 = lVar29 + 0x18;
          lVar9 = lVar9 + 0x48;
        } while (lVar22 < (long)uVar20);
        iVar21 = (this->super_EDPF).super_ED.segmentNos;
      }
      pLVar27 = local_198.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar23 = lVar26;
    } while (lVar26 < iVar21);
  }
  pLVar11 = local_198.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
            super__Vector_impl_data._M_finish;
  iVar21 = *local_160;
  pEVar19 = (EDArcs *)operator_new(0x10);
  iVar21 = ((int)((ulong)((long)pLVar11 - (long)pLVar27) >> 3) * 0x38e38e39) / 3 + iVar21 * 2;
  EDArcs::EDArcs(pEVar19,iVar21);
  this->edarcs1 = pEVar19;
  std::vector<LineSegment,_std::allocator<LineSegment>_>::vector(&local_d0,&local_198);
  DetectArcs(this,&local_d0);
  if (local_d0.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  pEVar19 = (EDArcs *)operator_new(0x10);
  EDArcs::EDArcs(pEVar19,iVar21);
  this->edarcs2 = pEVar19;
  JoinArcs1(this);
  pEVar19 = (EDArcs *)operator_new(0x10);
  EDArcs::EDArcs(pEVar19,iVar21);
  this->edarcs3 = pEVar19;
  JoinArcs2(this);
  pEVar19 = (EDArcs *)operator_new(0x10);
  EDArcs::EDArcs(pEVar19,iVar21);
  this->edarcs4 = pEVar19;
  JoinArcs3(this);
  GenerateCandidateCircles(this);
  this->noCircles2 = 0;
  uVar28 = (ulong)iVar21;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar28;
  uVar20 = 0xffffffffffffffff;
  if (SUB168(auVar6 * ZEXT816(0x98),8) == 0) {
    uVar20 = SUB168(auVar6 * ZEXT816(0x98),0);
  }
  pCVar13 = (Circle *)operator_new__(uVar20);
  if (iVar21 != 0) {
    lVar23 = 0;
    do {
      puVar1 = (undefined8 *)((long)(pCVar13->eq).coeff + lVar23 + 0x20);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)(pCVar13->eq).coeff + lVar23 + 0x10);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)(pCVar13->eq).coeff + lVar23);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)(pCVar13->eq).coeff + lVar23 + 0x30) = 0;
      lVar23 = lVar23 + 0x98;
    } while (uVar28 * 0x98 - lVar23 != 0);
  }
  this->circles2 = pCVar13;
  local_118.coeff[2] = 0.0;
  local_118.coeff[0] = (double)CONCAT44(local_118.coeff[0]._4_4_,0x1010000);
  local_118.coeff[1] = (double)local_e0;
  local_148.center.y = (double)&(this->super_EDPF).super_ED.smoothImage;
  local_148.axes.width = 0;
  local_148.axes.height = 0;
  local_148.center.x = (double)CONCAT44(local_148.center.x._4_4_,0x2010000);
  local_98 = 0;
  cv::GaussianBlur(0x3fe0000000000000,0);
  ValidateCircles(this);
  this->noCircles3 = 0;
  pCVar13 = (Circle *)operator_new__(uVar20);
  if (iVar21 != 0) {
    lVar23 = 0;
    do {
      puVar1 = (undefined8 *)((long)(pCVar13->eq).coeff + lVar23 + 0x20);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)(pCVar13->eq).coeff + lVar23 + 0x10);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)(pCVar13->eq).coeff + lVar23);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)(pCVar13->eq).coeff + lVar23 + 0x30) = 0;
      lVar23 = lVar23 + 0x98;
    } while (uVar28 * 0x98 - lVar23 != 0);
  }
  this->circles3 = pCVar13;
  JoinCircles(this);
  this->noEllipses = 0;
  this->noCircles = 0;
  iVar21 = this->noCircles3;
  if (0 < (long)iVar21) {
    lVar23 = 0;
    iVar24 = 0;
    iVar25 = 0;
    do {
      if (*(char *)((long)(&this->circles3->eq + 1) + lVar23 + 8) == '\x01') {
        iVar25 = iVar25 + 1;
        this->noEllipses = iVar25;
      }
      else {
        iVar24 = iVar24 + 1;
        this->noCircles = iVar24;
      }
      lVar23 = lVar23 + 0x98;
    } while ((long)iVar21 * 0x98 - lVar23 != 0);
    if (0 < iVar21) {
      lVar23 = 0;
      lVar22 = 0;
      do {
        pCVar13 = this->circles3;
        if (*(char *)((long)(&pCVar13->eq + 1) + lVar23 + 8) == '\x01') {
          local_118.coeff[6] = *(double *)((long)(pCVar13->eq).coeff + lVar23 + 0x30);
          pdVar17 = (double *)((long)(pCVar13->eq).coeff + lVar23);
          local_118.coeff[0] = *pdVar17;
          local_118.coeff[1] = pdVar17[1];
          pdVar17 = (double *)((long)(pCVar13->eq).coeff + lVar23 + 0x10);
          local_118.coeff[2] = *pdVar17;
          local_118.coeff[3] = pdVar17[1];
          pdVar17 = (double *)((long)(pCVar13->eq).coeff + lVar23 + 0x20);
          local_118.coeff[4] = *pdVar17;
          local_118.coeff[5] = pdVar17[1];
          local_148.theta =
               ComputeEllipseCenterAndAxisLengths
                         (&local_118,&local_1b0,(double *)&local_1a0,&local_1a8,&local_180);
          local_148.center.x = local_1b0;
          local_148.center.y = (double)local_1a0;
          local_148.axes.height = (int)ROUND(local_180);
          local_148.axes.width = (int)ROUND(local_1a8);
          std::vector<mEllipse,_std::allocator<mEllipse>_>::emplace_back<mEllipse>
                    (local_158,&local_148);
        }
        else {
          local_118.coeff[2] = *(double *)((long)(pCVar13->eq).coeff + lVar23 + -0x30);
          pdVar17 = (double *)((long)(pCVar13->eq).coeff + lVar23 + -0x40);
          local_118.coeff[0] = *pdVar17;
          local_118.coeff[1] = pdVar17[1];
          std::vector<mCircle,_std::allocator<mCircle>_>::emplace_back<mCircle>
                    (local_150,(mCircle *)&local_118);
        }
        lVar22 = lVar22 + 1;
        lVar23 = lVar23 + 0x98;
      } while (lVar22 < this->noCircles3);
    }
  }
  pEVar19 = this->edarcs1;
  if ((pEVar19 != (EDArcs *)0x0) && (pEVar19->arcs != (MyArc *)0x0)) {
    operator_delete__(pEVar19->arcs);
  }
  operator_delete(pEVar19);
  pEVar19 = this->edarcs2;
  if ((pEVar19 != (EDArcs *)0x0) && (pEVar19->arcs != (MyArc *)0x0)) {
    operator_delete__(pEVar19->arcs);
  }
  operator_delete(pEVar19);
  pEVar19 = this->edarcs3;
  if ((pEVar19 != (EDArcs *)0x0) && (pEVar19->arcs != (MyArc *)0x0)) {
    operator_delete__(pEVar19->arcs);
  }
  operator_delete(pEVar19);
  pEVar19 = this->edarcs4;
  if ((pEVar19 != (EDArcs *)0x0) && (pEVar19->arcs != (MyArc *)0x0)) {
    operator_delete__(pEVar19->arcs);
  }
  operator_delete(pEVar19);
  if (this->circles1 != (Circle *)0x0) {
    operator_delete__(this->circles1);
  }
  if (this->circles2 != (Circle *)0x0) {
    operator_delete__(this->circles2);
  }
  if (this->circles3 != (Circle *)0x0) {
    operator_delete__(this->circles3);
  }
  pBVar16 = this->bm;
  if (pBVar16 != (BufferManager *)0x0) {
    BufferManager::~BufferManager(pBVar16);
  }
  operator_delete(pBVar16);
  if (this->segmentStartLines != (int *)0x0) {
    operator_delete__(this->segmentStartLines);
  }
  if (this->info != (Info *)0x0) {
    operator_delete__(this->info);
  }
  if (local_198.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

EDCircles::EDCircles(Mat srcImage)
	: EDPF(srcImage)
{
	// Arcs & circles to be detected
	// If the end-points of the segment is very close to each other, 
	// then directly fit a circle/ellipse instread of line fitting
	noCircles1 = 0;
	circles1 = new Circle[(width + height) * 8];

	// ----------------------------------- DETECT LINES ---------------------------------
	int bufferSize = 0;
	for (int i = 0; i < segmentPoints.size(); i++) 
		bufferSize += (int)segmentPoints[i].size();

	// Compute the starting line number for each segment
	segmentStartLines = new int[segmentNos + 1];

	bm = new BufferManager(bufferSize * 8);
	vector<LineSegment> lines;


#define CIRCLE_MIN_LINE_LEN 6

	for (int i = 0; i < segmentNos; i++) {

		// Make note of the starting line number for this segment
		segmentStartLines[i] = (int)lines.size();

		int noPixels = (int)segmentPoints[i].size();

		if (noPixels < 2 * CIRCLE_MIN_LINE_LEN) 
			continue;

		double *x = bm->getX();
		double *y = bm->getY();

		for (int j = 0; j<noPixels; j++) {
			x[j] = segmentPoints[i][j].x;
			y[j] = segmentPoints[i][j].y;
		} //end-for

		  // If the segment is reasonably long, then see if the segment traverses the boundary of a closed shape
		if (noPixels >= 4 * CIRCLE_MIN_LINE_LEN) {
			// If the end-points of the segment is close to each other, then assume a circular/elliptic structure
			double dx = x[0] - x[noPixels - 1];
			double dy = y[0] - y[noPixels - 1];
			double d = sqrt(dx*dx + dy*dy);
			double r = noPixels / TWOPI;      // Assume a complete circle

			double maxDistanceBetweenEndPoints = MAX(3, r / 4);

			// If almost closed loop, then try to fit a circle/ellipse
			if (d <= maxDistanceBetweenEndPoints) {
				double xc, yc, r, circleFitError = 1e10;

				CircleFit(x, y, noPixels, &xc, &yc, &r, &circleFitError);

				EllipseEquation eq;
				double ellipseFitError = 1e10;

				if (circleFitError > LONG_ARC_ERROR) {
					// Try fitting an ellipse
					if (EllipseFit(x, y, noPixels, &eq)) 
						ellipseFitError = ComputeEllipseError(&eq, x, y, noPixels);
				} //end-if

				if (circleFitError <= LONG_ARC_ERROR) {
					addCircle(circles1, noCircles1, xc ,yc, r, circleFitError, x, y, noPixels);
					bm->move(noPixels);
					continue;

				}
				else if (ellipseFitError <= ELLIPSE_ERROR) {
					double major, minor;
					ComputeEllipseCenterAndAxisLengths(&eq, &xc, &yc, &major, &minor);

					// Assume major is longer. Otherwise, swap
					if (minor > major) { double tmp = major; major = minor; minor = tmp; }

					if (major < 8 * minor) {
						addCircle(circles1, noCircles1,xc, yc, r, circleFitError, &eq, ellipseFitError, x, y, noPixels);
						bm->move(noPixels);
					} //end-if

					continue;
				} //end-else
			} //end-if 
		} //end-if
		
		// Otherwise, split to lines
		EDLines::SplitSegment2Lines(x, y, noPixels, i, lines);
	}

	segmentStartLines[segmentNos] = (int)lines.size();

	// ------------------------------- DETECT ARCS ---------------------------------

	info = new Info[lines.size()];

	// Compute the angle information for each line segment
	for (int i = 0; i<segmentNos; i++) {
		for (int j = segmentStartLines[i]; j<segmentStartLines[i + 1]; j++) {
			LineSegment *l1 = &lines[j];
			LineSegment *l2;

			if (j == segmentStartLines[i + 1] - 1) l2 = &lines[segmentStartLines[i]];
			else                               l2 = &lines[j + 1];

#if 1
			// If the end points of the lines are far from each other, then stop at this line
			double dx = l1->ex - l2->sx;
			double dy = l1->ey - l2->sy;
			double d = sqrt(dx*dx + dy*dy);
			if (d >= 15) { info[j].angle = 10; info[j].sign = 2; info[j].taken = false; continue; }
#endif

			// Compute the angle between the lines & their turn direction
			double v1x = l1->ex - l1->sx;
			double v1y = l1->ey - l1->sy;
			double v1Len = sqrt(v1x*v1x + v1y*v1y);

			double v2x = l2->ex - l2->sx;
			double v2y = l2->ey - l2->sy;
			double v2Len = sqrt(v2x*v2x + v2y*v2y);

			double dotProduct = (v1x*v2x + v1y*v2y) / (v1Len*v2Len);
			if (dotProduct > 1.0) dotProduct = 1.0;
			else if (dotProduct < -1.0) dotProduct = -1.0;

			info[j].angle = acos(dotProduct);
			info[j].sign = (v1x*v2y - v2x*v1y) >= 0 ? 1 : -1;  // compute cross product
			info[j].taken = false;
		} //end-for
	} //end-for

	// This is how much space we will allocate for circles buffers
	int maxNoOfCircles = (int)lines.size() / 3 + noCircles1 * 2;

	edarcs1 = new EDArcs(maxNoOfCircles);
	DetectArcs(lines);    // Detect all arcs

	// Try to join arcs that are almost perfectly circular. 
	// Use the distance between the arc end-points as a metric in choosing in choosing arcs to join
	edarcs2 = new EDArcs(maxNoOfCircles);
	JoinArcs1();

	// Try to join arcs that belong to the same segment
	edarcs3 = new EDArcs(maxNoOfCircles);
	JoinArcs2();

	// Try to combine arcs that belong to different segments
	edarcs4 = new EDArcs(maxNoOfCircles);     // The remaining arcs
	JoinArcs3();

	// Finally, go over the arcs & circles, and generate candidate circles
	GenerateCandidateCircles();

	//----------------------------- VALIDATE CIRCLES --------------------------
	noCircles2 = 0;
	circles2 = new Circle[maxNoOfCircles];
	GaussianBlur(srcImage, smoothImage, Size(), 0.50); // calculate kernel from sigma;

	ValidateCircles();

	//----------------------------- JOIN CIRCLES --------------------------
	noCircles3 = 0;
	circles3 = new Circle[maxNoOfCircles];
	JoinCircles();

	noCircles = 0;
	noEllipses = 0;
	for (int i = 0; i < noCircles3; i++) {
		if (circles3[i].isEllipse)
			noEllipses++;
		else
			noCircles++;
	}

	for (int i = 0; i<noCircles3; i++) {
		if (circles3[i].isEllipse) {
			EllipseEquation eq = circles3[i].eq;
			double xc;
			double yc;
			double a;
			double b;
			double theta = ComputeEllipseCenterAndAxisLengths(&eq, &xc, &yc, &a, &b);
			ellipses.push_back(mEllipse(Point2d(xc, yc), Size2d(a, b), theta));

		}
		else {
			double r = circles3[i].r;
			double xc = circles3[i].xc;
			double yc = circles3[i].yc;

			circles.push_back(mCircle(Point2d(xc, yc), r));
			
		} //end-else
	} //end-for


	// clean up
	delete edarcs1;
	delete edarcs2;
	delete edarcs3;
	delete edarcs4;

	delete[] circles1;
	delete[] circles2;
	delete[] circles3;

	delete bm;
	delete[] segmentStartLines;
	delete[] info;
}